

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O2

int fetch_escaped_value_raw(OnigUChar **src,OnigUChar *end,ParseEnv *env,OnigCodePoint *val)

{
  OnigEncoding pOVar1;
  OnigSyntaxType *pOVar2;
  OnigCodePoint OVar3;
  int iVar4;
  OnigUChar *pOVar5;
  OnigCodePoint local_44;
  OnigUChar *local_40;
  OnigUChar **local_38;
  
  pOVar5 = *src;
  if (end <= pOVar5) {
    return -0x68;
  }
  pOVar1 = env->enc;
  local_38 = src;
  OVar3 = (*pOVar1->mbc_to_code)(pOVar5,end);
  iVar4 = (*pOVar1->mbc_enc_len)(pOVar5);
  pOVar5 = pOVar5 + iVar4;
  pOVar2 = env->syntax;
  local_40 = pOVar5;
  if (OVar3 == 0x43) {
    if ((pOVar2->op2 & 0x800) != 0) {
      if (end <= pOVar5) {
        return -0x6a;
      }
      OVar3 = (*pOVar1->mbc_to_code)(pOVar5,end);
      iVar4 = (*pOVar1->mbc_enc_len)(pOVar5);
      if (OVar3 != 0x2d) {
        return -0x6d;
      }
      pOVar5 = pOVar5 + iVar4;
LAB_001132e4:
      if (end <= pOVar5) {
        return -0x6a;
      }
      OVar3 = (*pOVar1->mbc_to_code)(pOVar5,end);
      local_44 = OVar3;
      iVar4 = (*pOVar1->mbc_enc_len)(pOVar5);
      local_40 = pOVar5 + iVar4;
      if (OVar3 == 0x3f) {
        OVar3 = 0x7f;
      }
      else {
        if ((OVar3 == (env->syntax->meta_char_table).esc) &&
           (iVar4 = fetch_escaped_value_raw(&local_40,end,env,&local_44), OVar3 = local_44,
           iVar4 < 0)) {
          return iVar4;
        }
        OVar3 = OVar3 & 0x9f;
      }
      goto switchD_00113353_caseD_6f;
    }
  }
  else if (OVar3 == 99) {
    if ((pOVar2->op & 0x8000000) != 0) goto LAB_001132e4;
  }
  else if ((OVar3 == 0x4d) && ((pOVar2->op2 & 0x1000) != 0)) {
    if (end <= pOVar5) {
      return -0x69;
    }
    OVar3 = (*pOVar1->mbc_to_code)(pOVar5,end);
    iVar4 = (*pOVar1->mbc_enc_len)(pOVar5);
    if (OVar3 != 0x2d) {
      return -0x6c;
    }
    pOVar5 = pOVar5 + iVar4;
    if (end <= pOVar5) {
      return -0x69;
    }
    OVar3 = (*pOVar1->mbc_to_code)(pOVar5,end);
    local_44 = OVar3;
    iVar4 = (*pOVar1->mbc_enc_len)(pOVar5);
    local_40 = pOVar5 + iVar4;
    if ((OVar3 == (env->syntax->meta_char_table).esc) &&
       (iVar4 = fetch_escaped_value_raw(&local_40,end,env,&local_44), OVar3 = local_44, iVar4 < 0))
    {
      return iVar4;
    }
    OVar3 = OVar3 & 0xff | 0x80;
    goto switchD_00113353_caseD_6f;
  }
  if ((pOVar2->op & 0x4000000) != 0) {
    switch(OVar3) {
    case 0x61:
      OVar3 = 7;
      break;
    case 0x62:
      OVar3 = 8;
      break;
    case 99:
    case 100:
      break;
    case 0x65:
      OVar3 = 0x1b;
      break;
    case 0x66:
      OVar3 = 0xc;
      break;
    default:
      switch(OVar3) {
      case 0x6e:
        OVar3 = 10;
        break;
      case 0x72:
        OVar3 = 0xd;
        break;
      case 0x74:
        OVar3 = 9;
        break;
      case 0x76:
        if ((pOVar2->op2 & 0x2000) != 0) {
          OVar3 = 0xb;
        }
      }
    }
  }
switchD_00113353_caseD_6f:
  *local_38 = local_40;
  *val = OVar3;
  return 0;
}

Assistant:

static int
fetch_escaped_value_raw(UChar** src, UChar* end, ParseEnv* env,
                        OnigCodePoint* val)
{
  int v;
  OnigCodePoint c;
  OnigEncoding enc = env->enc;
  UChar* p = *src;

  if (PEND) return ONIGERR_END_PATTERN_AT_ESCAPE;

  PFETCH_S(c);
  switch (c) {
  case 'M':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_M_BAR_META)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_META_CODE_SYNTAX;
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c == MC_ESC(env->syntax)) {
        v = fetch_escaped_value_raw(&p, end, env, &c);
        if (v < 0) return v;
      }
      c = ((c & 0xff) | 0x80);
    }
    else
      goto backslash;
    break;

  case 'C':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_C_BAR_CONTROL)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_CONTROL_CODE_SYNTAX;
      goto control;
    }
    else
      goto backslash;

  case 'c':
    if (IS_SYNTAX_OP(env->syntax, ONIG_SYN_OP_ESC_C_CONTROL)) {
    control:
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c == '?') {
        c = 0177;
      }
      else {
        if (c == MC_ESC(env->syntax)) {
          v = fetch_escaped_value_raw(&p, end, env, &c);
          if (v < 0) return v;
        }
        c &= 0x9f;
      }
      break;
    }
    /* fall through */

  default:
    {
    backslash:
      c = conv_backslash_value(c, env);
    }
    break;
  }

  *src = p;
  *val = c;
  return 0;
}